

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QString * __thiscall QWidget::windowTitle(QString *__return_storage_ptr__,QWidget *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QFileInfo local_80 [8];
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QString,_QLatin1String> local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if ((lVar1 != 0) && (lVar1 = *(long *)(lVar1 + 8), lVar1 != 0)) {
    if (*(long *)(lVar1 + 0x38) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar1 + 0x28));
        return __return_storage_ptr__;
      }
      goto LAB_002f9e5c;
    }
    if (*(long *)(lVar1 + 0x80) != 0) {
      QFileInfo::QFileInfo(local_80,(QString *)(lVar1 + 0x70));
      QFileInfo::fileName();
      local_58.a.d.size = local_78.size;
      local_58.a.d.ptr = local_78.ptr;
      local_58.a.d.d = local_78.d;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      local_58.b.m_size = 3;
      local_58.b.m_data = "[*]";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(__return_storage_ptr__,&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QFileInfo::~QFileInfo(local_80);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      goto LAB_002f9e5c;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_002f9e5c:
  __stack_chk_fail();
}

Assistant:

QString QWidget::windowTitle() const
{
    Q_D(const QWidget);
    if (d->extra && d->extra->topextra) {
        if (!d->extra->topextra->caption.isEmpty())
            return d->extra->topextra->caption;
        if (!d->extra->topextra->filePath.isEmpty())
            return QFileInfo(d->extra->topextra->filePath).fileName() + "[*]"_L1;
    }
    return QString();
}